

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgio.c
# Opt level: O2

int fd_recv(int sock,int *fds,size_t nfds)

{
  int *piVar1;
  ssize_t sVar2;
  cmsghdr *__cmsg;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 local_91;
  int *local_90;
  int *local_88;
  ulong local_80;
  iovec iov;
  msghdr msg;
  
  if (fds == (int *)0x0 || nfds == 0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    return -1;
  }
  uVar7 = 0;
  local_80 = nfds;
  while( true ) {
    uVar8 = (ulong)uVar7;
    uVar9 = local_80 - uVar8;
    if (local_80 < uVar8 || uVar9 == 0) {
      return 0;
    }
    if (0x5e7 < uVar9) {
      uVar9 = 0x5e8;
    }
    if (sock < 0) {
      __assert_fail("sock >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                    ,0x11d,"int fd_package_recv(int, int *, size_t)");
    }
    bzero(&msg,0x38);
    bzero(&iov,0x10);
    iov.iov_base = &local_91;
    iov.iov_len = 1;
    msg.msg_iovlen = 1;
    msg.msg_controllen = uVar9 * 0x18;
    msg.msg_iov = &iov;
    msg.msg_control = calloc(1,msg.msg_controllen);
    if (msg.msg_control == (void *)0x0) break;
    local_88 = fds + uVar8;
    while( true ) {
      fd_wait(sock,true);
      sVar2 = recvmsg(sock,(msghdr *)&msg,0x40000000);
      if (sVar2 != -1) break;
      piVar1 = __errno_location();
      iVar5 = *piVar1;
      if (iVar5 != 4) goto LAB_001066c1;
    }
    uVar4 = 0;
    __cmsg = (cmsghdr *)msg.msg_control;
    local_90 = fds;
    if (msg.msg_controllen < 0x10) {
      __cmsg = (cmsghdr *)0x0;
      uVar4 = 0;
    }
    while( true ) {
      uVar6 = (ulong)uVar4;
      if ((__cmsg == (cmsghdr *)0x0) || (uVar9 <= uVar6)) break;
      if ((__cmsg->cmsg_level != 1) || (__cmsg->cmsg_type != 1)) {
LAB_00106682:
        piVar1 = __errno_location();
        *piVar1 = 0x16;
        goto LAB_0010668d;
      }
      uVar3 = __cmsg->cmsg_len + 0x3fffffff0;
      uVar4 = (int)(uVar3 >> 2) + uVar4;
      if ((uint)uVar9 < uVar4) goto LAB_00106682;
      memmove(local_88 + uVar6,__cmsg + 1,uVar3 & 0x3fffffffc);
      __cmsg = __cmsg_nxthdr((msghdr *)&msg,__cmsg);
    }
    if ((__cmsg != (cmsghdr *)0x0) || (uVar6 < uVar9)) goto LAB_0010668d;
    piVar1 = __errno_location();
    iVar5 = *piVar1;
    free(msg.msg_control);
    *piVar1 = iVar5;
    uVar7 = uVar7 + (uint)uVar9;
    fds = local_90;
  }
LAB_001066ce:
  piVar1 = __errno_location();
  iVar5 = *piVar1;
  for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    close(fds[uVar9]);
  }
  *piVar1 = iVar5;
  return -1;
LAB_0010668d:
  piVar1 = local_88;
  for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
    if (-1 < piVar1[uVar9]) {
      close(piVar1[uVar9]);
    }
  }
  piVar1 = __errno_location();
  *piVar1 = 0x16;
  iVar5 = 0x16;
  fds = local_90;
LAB_001066c1:
  free(msg.msg_control);
  *piVar1 = iVar5;
  goto LAB_001066ce;
}

Assistant:

int
fd_recv(int sock, int *fds, size_t nfds)
{
	unsigned int i, step, j;
	int ret, serrno;

	if (nfds == 0 || fds == NULL) {
		errno = EINVAL;
		return (-1);
	}

	ret = i = step = 0;
	while (i < nfds) {
		if (PKG_MAX_SIZE < nfds - i)
			step = PKG_MAX_SIZE;
		else
			step = nfds - i;
		ret = fd_package_recv(sock, fds + i, step);
		if (ret != 0) {
			/* Close all received descriptors. */
			serrno = errno;
			for (j = 0; j < i; j++)
				close(fds[j]);
			errno = serrno;
			break;
		}
		i += step;
	}

	return (ret);
}